

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

bool __thiscall QPDFFormFieldObjectHelper::isRadioButton(QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  uint uVar2;
  string local_30;
  
  getFieldType_abi_cxx11_(&local_30,this);
  bVar1 = std::operator==(&local_30,"/Btn");
  if (bVar1) {
    uVar2 = getFlags(this);
    bVar1 = SUB41((uVar2 & 0xffff) >> 0xf,0);
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool
QPDFFormFieldObjectHelper::isRadioButton()
{
    return ((getFieldType() == "/Btn") && ((getFlags() & ff_btn_radio) == ff_btn_radio));
}